

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::MergeConstPortVisitor::visit(MergeConstPortVisitor *this,Generator *generator)

{
  size_t *psVar1;
  bool bVar2;
  VarType VVar3;
  int iVar4;
  StatementType SVar5;
  StatementBlockType SVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  size_type sVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar9;
  undefined4 extraout_var_02;
  element_type *peVar10;
  element_type *this_00;
  Var **ppVVar11;
  undefined4 extraout_var_03;
  Generator *pGVar12;
  reference var_name_00;
  reference stmt_00;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end2_2;
  iterator __begin2_2;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_158 [32];
  Var *local_138;
  Var *sink_to;
  Var *source_from;
  undefined1 local_120 [8];
  shared_ptr<kratos::StmtBlock> blk;
  Stmt *src_stmt_parent;
  undefined1 local_100 [8];
  value_type sink_stmt;
  undefined1 local_e8 [8];
  value_type source_stmt;
  undefined1 local_c8 [24];
  shared_ptr<kratos::Var> *var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars_to_remove;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  Generator *generator_local;
  MergeConstPortVisitor *this_local;
  
  Generator::get_vars_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count,generator);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         *)&__range2);
  psVar1 = &vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
  var_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&var_name);
    if (!bVar2) {
      psVar1 = &stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end2_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)psVar1);
      var_name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)psVar1);
      while (bVar2 = std::operator!=(&__end2_1,(_Self *)&var_name_1), bVar2) {
        var_name_00 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2_1);
        Generator::remove_var(generator,var_name_00);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2_1);
      }
      __end2_2 = std::
                 set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ::begin((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          *)&__range2);
      stmt = (shared_ptr<kratos::Stmt> *)
             std::
             set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ::end((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    *)&__range2);
      while (bVar2 = std::operator!=(&__end2_2,(_Self *)&stmt), bVar2) {
        stmt_00 = std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator*(&__end2_2)
        ;
        Generator::remove_stmt(generator,stmt_00);
        std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator++(&__end2_2);
      }
      std::
      set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ::~set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              *)&__range2);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    var = (shared_ptr<kratos::Var> *)
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
    Generator::get_var((Generator *)local_c8,(string *)generator);
    local_c8._16_8_ = local_c8;
    peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c8._16_8_);
    VVar3 = Var::type(peVar7);
    if (VVar3 == Base) {
      peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8._16_8_);
      iVar4 = (*(peVar7->super_IRNode)._vptr_IRNode[0x10])();
      sVar8 = std::
              unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var,iVar4));
      if (sVar8 != 1) goto LAB_00ac67e5;
      peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8._16_8_);
      iVar4 = (*(peVar7->super_IRNode)._vptr_IRNode[0xe])();
      sVar8 = std::
              unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_00,iVar4));
      if (sVar8 != 1) goto LAB_00ac67e5;
      peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8._16_8_);
      iVar4 = (*(peVar7->super_IRNode)._vptr_IRNode[0x10])();
      sink_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_01,iVar4));
      pvVar9 = std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
               ::operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *
                           )&sink_stmt.
                             super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      std::shared_ptr<kratos::AssignStmt>::shared_ptr
                ((shared_ptr<kratos::AssignStmt> *)local_e8,pvVar9);
      peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8._16_8_);
      iVar4 = (*(peVar7->super_IRNode)._vptr_IRNode[0xe])();
      src_stmt_parent =
           (Stmt *)std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)CONCAT44(extraout_var_02,iVar4));
      pvVar9 = std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
               ::operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *
                           )&src_stmt_parent);
      std::shared_ptr<kratos::AssignStmt>::shared_ptr
                ((shared_ptr<kratos::AssignStmt> *)local_100,pvVar9);
      peVar10 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_e8);
      blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Stmt::stmt_parent(&peVar10->super_Stmt);
      if (((Stmt *)blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi == (Stmt *)0x0) ||
         (SVar5 = Stmt::type((Stmt *)blk.
                                     super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi), SVar5 != Block)) {
LAB_00ac6547:
        peVar10 = std::
                  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_e8);
        ppVVar11 = AssignStmt::right(peVar10);
        sink_to = *ppVVar11;
        peVar10 = std::
                  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_100);
        ppVVar11 = AssignStmt::left(peVar10);
        local_138 = *ppVVar11;
        VVar3 = Var::type(sink_to);
        if ((VVar3 == ConstValue) && (VVar3 = Var::type(local_138), VVar3 == PortIO)) {
          iVar4 = (*(local_138->super_IRNode)._vptr_IRNode[0xd])();
          pGVar12 = (Generator *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x20))();
          if (pGVar12 == generator) {
            (*(local_138->super_IRNode)._vptr_IRNode[0x12])(local_138,0);
            Var::assign((Var *)local_158,local_138,(AssignmentType)sink_to);
            std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                      ((shared_ptr<kratos::Stmt> *)(local_158 + 0x10),
                       (shared_ptr<kratos::AssignStmt> *)local_158);
            Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)(local_158 + 0x10));
            std::shared_ptr<kratos::Stmt>::~shared_ptr
                      ((shared_ptr<kratos::Stmt> *)(local_158 + 0x10));
            std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                      ((shared_ptr<kratos::AssignStmt> *)local_158);
            peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_c8._16_8_);
            (*(peVar7->super_IRNode)._vptr_IRNode[0xf])(peVar7,local_100);
            peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_c8._16_8_);
            (*(peVar7->super_IRNode)._vptr_IRNode[0x13])(peVar7,local_e8);
            std::
            set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
            ::emplace<std::shared_ptr<kratos::AssignStmt>&>
                      ((set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                        *)&__range2,(shared_ptr<kratos::AssignStmt> *)local_100);
            std::
            set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
            ::emplace<std::shared_ptr<kratos::AssignStmt>&>
                      ((set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                        *)&__range2,(shared_ptr<kratos::AssignStmt> *)local_e8);
            std::
            set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::emplace<std::__cxx11::string_const&>
                      ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&stmts_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var);
          }
        }
        source_from._4_4_ = 0;
      }
      else {
        Stmt::as<kratos::StmtBlock>((Stmt *)local_120);
        this_00 = std::
                  __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_120);
        SVar6 = StmtBlock::block_type(this_00);
        if (SVar6 == Initial) {
          source_from._4_4_ = 3;
        }
        else {
          source_from._4_4_ = 0;
        }
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_120);
        if (source_from._4_4_ == 0) goto LAB_00ac6547;
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_100);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_e8);
      if (source_from._4_4_ == 0) goto LAB_00ac67e5;
    }
    else {
LAB_00ac67e5:
      source_from._4_4_ = 0;
    }
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_c8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        // scan each var that's one source and one sink, where the source is a constant
        // and the sink is a child generator instance input port
        auto const vars = generator->get_vars();
        std::set<std::string> vars_to_remove;
        std::set<std::shared_ptr<Stmt>> stmts_to_remove;

        for (auto const& var_name : vars) {
            auto const& var = generator->get_var(var_name);
            if (var->type() == VarType::Base && var->sources().size() == 1 &&
                var->sinks().size() == 1) {
                auto source_stmt = *(var->sources().begin());
                auto sink_stmt = *(var->sinks().begin());
                auto* src_stmt_parent = source_stmt->stmt_parent();
                if (src_stmt_parent && src_stmt_parent->type() == StatementType::Block) {
                    auto blk = src_stmt_parent->as<StmtBlock>();
                    if (blk->block_type() == StatementBlockType::Initial) {
                        // initial is allowed to have constant driver
                        continue;
                    }
                }
                auto* source_from = source_stmt->right();
                auto* sink_to = sink_stmt->left();
                if (source_from->type() == VarType::ConstValue &&
                    sink_to->type() == VarType::PortIO &&
                    sink_to->generator()->parent() == generator) {
                    sink_to->clear_sources(false);
                    generator->add_stmt(sink_to->assign(*source_from, AssignmentType::Blocking));
                    var->remove_sink(sink_stmt);
                    var->remove_source(source_stmt);
                    stmts_to_remove.emplace(sink_stmt);
                    stmts_to_remove.emplace(source_stmt);
                    vars_to_remove.emplace(var_name);
                }
            }
        }

        for (auto const& var_name : vars_to_remove) {
            generator->remove_var(var_name);
        }
        for (auto const& stmt : stmts_to_remove) {
            generator->remove_stmt(stmt);
        }
    }